

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::SetStackNestedFuncParent(FunctionBody *this,FunctionInfo *parentFunctionInfo)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  long *plVar4;
  undefined4 *puVar5;
  RecyclerWeakReferenceBase *weakRef;
  
  pFVar3 = FunctionInfo::GetFunctionBody(parentFunctionInfo);
  plVar4 = (long *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,StackNestedFuncParent);
  if (plVar4 == (long *)0x0) {
    if (((pFVar3->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x105b,"(parentFunctionBody->DoStackNestedFunc())",
                                  "parentFunctionBody->DoStackNestedFunc()");
      if (!bVar2) goto LAB_00772c91;
      *puVar5 = 0;
    }
    recycler = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&recycler->weakReferenceMap,(char *)parentFunctionInfo,recycler);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&FunctionInfo::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
    }
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,StackNestedFuncParent,weakRef);
    return;
  }
  if ((FunctionInfo *)*plVar4 != parentFunctionInfo) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1054,"(parent->Get() == parentFunctionInfo)",
                                "parent->Get() == parentFunctionInfo");
    if (!bVar2) {
LAB_00772c91:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void FunctionBody::SetStackNestedFuncParent(FunctionInfo * parentFunctionInfo)
    {
        FunctionBody * parentFunctionBody = parentFunctionInfo->GetFunctionBody();
        RecyclerWeakReference<FunctionInfo>* parent = this->GetStackNestedFuncParent();
        if (parent != nullptr)
        {
            Assert(parent->Get() == parentFunctionInfo);
            return;
        }
//      Redeferral invalidates this assertion, as we may be recompiling with a different view of nested functions and
//      thus making different stack-nested-function decisions. I'm inclined to allow this, since things that have been
//      re-deferred will likely not be executed again, so it makes sense to exclude them from our analysis.
//        Assert(CanDoStackNestedFunc());
        Assert(parentFunctionBody->DoStackNestedFunc());

        this->SetAuxPtr<AuxPointerType::StackNestedFuncParent>(this->GetScriptContext()->GetRecycler()->CreateWeakReferenceHandle(parentFunctionInfo));
    }